

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

TreeEnsembleParameters_TreeNode_EvaluationInfo *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
          (Arena *arena)

{
  TreeEnsembleParameters_TreeNode_EvaluationInfo *this;
  
  if (arena == (Arena *)0x0) {
    this = (TreeEnsembleParameters_TreeNode_EvaluationInfo *)operator_new(0x28);
    CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
    TreeEnsembleParameters_TreeNode_EvaluationInfo(this,(Arena *)0x0,false);
  }
  else {
    this = (TreeEnsembleParameters_TreeNode_EvaluationInfo *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)
                      &CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
                       typeinfo);
    CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
    TreeEnsembleParameters_TreeNode_EvaluationInfo(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }